

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shared.cpp
# Opt level: O1

int __thiscall Log::overflow(Log *this,int c)

{
  if (c == -1) {
    (**(code **)(*(long *)this + 0x30))();
  }
  else {
    std::__cxx11::string::push_back((char)this + '@');
  }
  return c;
}

Assistant:

int Log::overflow(int c) {
    if (c != EOF) {
        buffer += static_cast<char>(c);
    } else {
        sync();
    }
    return c;
}